

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O3

_Bool borg_think_stair_scum(_Bool from_town)

{
  uint8_t uVar1;
  wchar_t wVar2;
  loc grid;
  _Bool _Var3;
  borg_need bVar4;
  square *psVar6;
  borg_track *pbVar7;
  loc_conflict lVar8;
  wchar_t wVar5;
  loc_conflict lVar9;
  uint uVar10;
  uint8_t uVar11;
  wchar_t wVar12;
  uint uVar13;
  ulong uVar14;
  keycode_t k;
  borg_grid *pbVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  
  pbVar15 = borg_grids[borg.c.y] + borg.c.x;
  grid.y = borg.c.y;
  grid.x = borg.c.x;
  psVar6 = square(cave,grid);
  uVar1 = psVar6->feat;
  borg_notice(true);
  if ((borg.trait[0x69] == 0) || (borg.trait[0x6c] != 0)) {
    borg_note("# Leaving Scumming Mode. (Town or Weak)");
    borg.lunal_mode = false;
    return false;
  }
  if (borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty != '\0') {
    return false;
  }
  if (uVar1 == '\x05') {
    if (pbVar15->feat != '\x05') {
      pbVar7 = &track_less;
      uVar10 = (uint)track_less.num;
      uVar11 = '\x05';
      uVar13 = 0;
      if (0 < track_less.num) {
        uVar13 = uVar10;
      }
      if ((-1 < track_less.num) && ((int)uVar13 < (int)track_less.size)) goto LAB_00244e84;
      goto LAB_00244ea3;
    }
  }
  else if ((uVar1 == '\x06') && (pbVar15->feat != '\x06')) {
    pbVar7 = &track_more;
    uVar10 = (uint)track_more.num;
    if (track_more.num < 1) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      do {
        if ((track_more.x[uVar14] == borg.c.x) && (track_more.y[uVar14] == borg.c.y))
        goto LAB_00244e76;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
      uVar14 = (ulong)uVar10;
    }
LAB_00244e76:
    uVar11 = '\x06';
    if (((uint)uVar14 == uVar10) && ((int)(uint)uVar14 < (int)track_more.size)) {
LAB_00244e84:
      pbVar7->x[uVar10] = borg.c.x;
      pbVar7->y[uVar10] = borg.c.y;
      pbVar7->num = (short)uVar10 + 1;
      uVar11 = uVar1;
    }
LAB_00244ea3:
    pbVar15->feat = uVar11;
  }
  bVar4 = borg_maintain_light();
  if (bVar4 == BORG_MET_NEED) {
    return true;
  }
  if (bVar4 == BORG_UNMET_NEED) {
    borg_note("# Scum. (need fuel)");
  }
  _Var3 = borg_flow_old(L'\x02');
  if (_Var3) {
    return true;
  }
  _Var3 = borg_flow_take_scum(true,L'\x06');
  if (_Var3) {
    return true;
  }
  borg_note("# Fleeing level. Scumming Mode");
  borg.goal.fleeing = true;
  wVar12 = L'\xffffffff';
  if ((track_more.num != 0) && (((byte)(pbVar15->feat - 5) < 2 || (borg.trait[0x69] < 0x1e)))) {
    if (1 < track_more.num) {
      borg_note("# Scumming Mode: I know of a down stair.");
    }
    wVar12 = L'\xffffffff';
    if (0 < track_more.num) {
      lVar16 = 0;
      do {
        lVar8 = loc(track_more.x[lVar16],track_more.y[lVar16]);
        lVar9.y = borg.c.y;
        lVar9.x = borg.c.x;
        wVar5 = distance(lVar9,lVar8);
        wVar2 = wVar5;
        if (wVar12 < wVar5) {
          wVar2 = wVar12;
        }
        bVar18 = wVar12 == L'\xffffffff';
        wVar12 = wVar2;
        if (bVar18) {
          wVar12 = wVar5;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < track_more.num);
      if (((L'\a' < wVar12) && (pbVar15->feat != '\x06')) && (0x1d < borg.trait[0x69]))
      goto LAB_00244ffa;
    }
    borg_note("# Scumming Mode.  Power Diving. ");
    _Var3 = borg_flow_old(L'\a');
    if (_Var3) {
      return true;
    }
    _Var3 = borg_flow_stair_more(7,false,false);
    if (_Var3) {
      return true;
    }
    if (pbVar15->feat == '\x06') {
      k = 0x3e;
      goto LAB_00244ff0;
    }
  }
LAB_00244ffa:
  if (((track_less.num != 0) && (borg.trait[0x69] != 1)) && ((byte)(pbVar15->feat - 5) < 2)) {
    lVar16 = (long)borg.c.x;
    pbVar15 = borg_grids[borg.c.y];
    if (0 < track_less.num) {
      lVar17 = 0;
      do {
        lVar9 = loc(track_less.x[lVar17],track_less.y[lVar17]);
        lVar8.y = borg.c.y;
        lVar8.x = borg.c.x;
        wVar5 = distance(lVar8,lVar9);
        wVar2 = wVar5;
        if (wVar12 < wVar5) {
          wVar2 = wVar12;
        }
        bVar18 = wVar12 == L'\xffffffff';
        wVar12 = wVar2;
        if (bVar18) {
          wVar12 = wVar5;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < track_less.num);
    }
    if ((wVar12 < L'\b') || (pbVar15[lVar16].feat == '\x05')) {
      borg_note("# Scumming Mode.  Power Climb. ");
      borg.goal.less = true;
      _Var3 = borg_flow_old(L'\a');
      if (_Var3) {
        return true;
      }
      _Var3 = borg_flow_stair_less(7,false);
      if (_Var3) {
        borg_note("# Looking for stairs. Scumming Mode.");
        return true;
      }
      if ((pbVar15[lVar16].feat == '\x05') && ((player->opts).opt[0x20] == false)) {
        k = 0x3c;
LAB_00244ff0:
        borg_keypress(k);
        return true;
      }
    }
  }
  if (1 < borg.trait[0x69]) {
    _Var3 = borg_flow_old(L'\a');
    if (_Var3) {
      return true;
    }
    borg_note("# Scumming Mode.  Any Stair. ");
    _Var3 = borg_flow_stair_both(7,true);
    if (_Var3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_think_stair_scum(bool from_town)
{
    int j, b_j = -1;
    int i;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    uint8_t feat  = square(cave, borg.c)->feat;

    enum borg_need need;

    /* examine equipment and swaps */
    borg_notice(true);

    /* No scumming mode if starving or in town */
    if (borg.trait[BI_CDEPTH] == 0 || borg.trait[BI_ISWEAK]) {
        borg_note("# Leaving Scumming Mode. (Town or Weak)");
        borg.lunal_mode = false;
        return false;
    }

    /* No scumming if inventory is full.  Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* if borg is just starting on this level, he may not
     * know that a stair is under him.  Cheat to see if one is
     * there
     */
    if (feat == FEAT_MORE && ag->feat != FEAT_MORE) {

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            /* We already knew about that one */
            if ((track_more.x[i] == borg.c.x) && (track_more.y[i] == borg.c.y))
                break;
        }

        /* Track the newly discovered "down stairs" */
        if ((i == track_more.num) && (i < track_more.size)) {
            track_more.x[i] = borg.c.x;
            track_more.y[i] = borg.c.y;
            track_more.num++;
        }
        /* tell the array */
        ag->feat = FEAT_MORE;
    }

    if (feat == FEAT_LESS && ag->feat != FEAT_LESS) {

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            /* We already knew about this one */
            if ((track_less.x[i] == borg.c.x) && (track_less.y[i] == borg.c.y))
                continue;
        }

        /* Track the newly discovered "up stairs" */
        if ((i == track_less.num) && (i < track_less.size)) {
            track_less.x[i] = borg.c.x;
            track_less.y[i] = borg.c.y;
            track_less.num++;
        }

        /* Tell the array */
        ag->feat = FEAT_LESS;
    }

    /** First deal with staying alive **/

    /* Hack -- require light */
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note("# Scum. (need fuel)");

    /** Track down some interesting gear **/
    /* XXX Should we allow him great flexibility in retrieving loot? (not always
     * safe?)*/
    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Find a (viewable) object */
    if (borg_flow_take_scum(true, 6))
        return true;

    /*leave level right away. */
    borg_note("# Fleeing level. Scumming Mode");
    borg.goal.fleeing = true;

    /* Scumming Mode - Going down */
    if (track_more.num
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS
            || borg.trait[BI_CDEPTH] < 30)) {
        int y, x;

        if (track_more.num >= 2)
            borg_note("# Scumming Mode: I know of a down stair.");

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            x = track_more.x[i];
            y = track_more.y[i];

            /* How far is the nearest down stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the downstair is close and path is safe, continue on */
        if (b_j < 8 || ag->feat == FEAT_MORE || borg.trait[BI_CDEPTH] < 30) {
            /* Note */
            borg_note("# Scumming Mode.  Power Diving. ");

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to DownStair */
            if (borg_flow_stair_more(GOAL_FLEE, false, false))
                return true;

            /* if standing on a stair */
            if (ag->feat == FEAT_MORE) {
                /* Take the DownStair */
                borg_keypress('>');

                return true;
            }
        }
    }

    /* Scumming Mode - Going up */
    if (track_less.num && borg.trait[BI_CDEPTH] != 1
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS)) {
        int y, x;

        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the upstair is close and safe path, continue */
        if (b_j < 8 || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Scumming Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, false)) {
                borg_note("# Looking for stairs. Scumming Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Special case where the borg is off a stair and there
     * is a monster in LOS.  He could freeze and unhook, or
     * move to the closest stair and risk the run.
     */
    if (borg.trait[BI_CDEPTH] >= 2) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Note */
        borg_note("# Scumming Mode.  Any Stair. ");

        /* Try to find some stairs */
        if (borg_flow_stair_both(GOAL_FLEE, true))
            return true;
    }

    /* return to normal borg_think_dungeon */
    return false;
}